

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  char **argv_local;
  int argc_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Hello world!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"This is an addition: ");
  iVar1 = addition(1,5);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    std::cout << "Hello world!" << std::endl;
    
    std::cout << "This is an addition: " << addition(1, 5) << std::endl;

    return 0;
}